

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handoff.cc
# Opt level: O2

bool bssl::apply_remote_features(SSL *ssl,CBS *in)

{
  unsigned_short *puVar1;
  unsigned_short *puVar2;
  stack_st_SSL_CIPHER *sk;
  tuple<bssl::SSLCipherPreferenceList_*,_bssl::internal::Deleter> this;
  StackIterator<stack_st_SSL_CIPHER> SVar3;
  StackIterator<stack_st_SSL_CIPHER> SVar4;
  bool bVar5;
  int iVar6;
  pointer __p;
  SSL_CIPHER *p;
  size_t sVar7;
  _Head_base<0UL,_bssl::SSLCipherPreferenceList_*,_false> _Var8;
  Type *pTVar9;
  OPENSSL_STACK *sk_00;
  SSLCipherPreferenceList *__p_00;
  unsigned_short *puVar10;
  long lVar11;
  ulong uVar12;
  iterator __begin1_2;
  StackIterator<stack_st_SSL_CIPHER> SVar13;
  Span<const_unsigned_short> SVar14;
  CBS groups;
  uint16_t id_1;
  UniquePtr<struct_stack_st_SSL_CIPHER> unsupported;
  UniquePtr<struct_stack_st_SSL_CIPHER> supported;
  Array<unsigned_short> new_configured_groups;
  Array<unsigned_short> supported_groups;
  CBS local_58;
  CBS ciphers;
  
  iVar6 = CBS_get_asn1(in,&ciphers,4);
  if (iVar6 == 0) {
    return false;
  }
  supported._M_t.super___uniq_ptr_impl<stack_st_SSL_CIPHER,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_stack_st_SSL_CIPHER_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_stack_st_SSL_CIPHER_*,_false>._M_head_impl =
       (__uniq_ptr_data<stack_st_SSL_CIPHER,_bssl::internal::Deleter,_true,_true>)
       OPENSSL_sk_new_null();
  if ((tuple<stack_st_SSL_CIPHER_*,_bssl::internal::Deleter>)
      supported._M_t.super___uniq_ptr_impl<stack_st_SSL_CIPHER,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_stack_st_SSL_CIPHER_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_stack_st_SSL_CIPHER_*,_false>._M_head_impl !=
      (_Head_base<0UL,_stack_st_SSL_CIPHER_*,_false>)0x0) {
    do {
      if (ciphers.len == 0) {
        _Var8._M_head_impl =
             *(SSLCipherPreferenceList **)
              &(((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>
                 ._M_t.super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->cipher_list)._M_t.
               super___uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>;
        if ((tuple<bssl::SSLCipherPreferenceList_*,_bssl::internal::Deleter>)_Var8._M_head_impl ==
            (_Head_base<0UL,_bssl::SSLCipherPreferenceList_*,_false>)0x0) {
          _Var8._M_head_impl =
               *(SSLCipherPreferenceList **)
                &(((ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->cipher_list)._M_t.
                 super___uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>;
        }
        sk = *(stack_st_SSL_CIPHER **)_Var8._M_head_impl;
        unsupported._M_t.super___uniq_ptr_impl<stack_st_SSL_CIPHER,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_stack_st_SSL_CIPHER_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_stack_st_SSL_CIPHER_*,_false>._M_head_impl =
             (__uniq_ptr_data<stack_st_SSL_CIPHER,_bssl::internal::Deleter,_true,_true>)
             OPENSSL_sk_new_null();
        if ((tuple<stack_st_SSL_CIPHER_*,_bssl::internal::Deleter>)
            unsupported._M_t.super___uniq_ptr_impl<stack_st_SSL_CIPHER,_bssl::internal::Deleter>.
            _M_t.super__Tuple_impl<0UL,_stack_st_SSL_CIPHER_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_stack_st_SSL_CIPHER_*,_false>._M_head_impl ==
            (_Head_base<0UL,_stack_st_SSL_CIPHER_*,_false>)0x0) goto LAB_0013caa2;
        groups.len = 0;
        groups.data = (uint8_t *)sk;
        SVar13 = end<stack_st_SSL_CIPHER>(sk);
        goto LAB_0013c8fb;
      }
      iVar6 = CBS_get_u16(&ciphers,(uint16_t *)&groups);
      if (iVar6 == 0) break;
      p = SSL_get_cipher_by_value((uint16_t)groups.data);
    } while ((p == (SSL_CIPHER *)0x0) ||
            (sVar7 = OPENSSL_sk_push((OPENSSL_STACK *)
                                     supported._M_t.
                                     super___uniq_ptr_impl<stack_st_SSL_CIPHER,_bssl::internal::Deleter>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_stack_st_SSL_CIPHER_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_stack_st_SSL_CIPHER_*,_false>.
                                     _M_head_impl,p), sVar7 != 0));
  }
  bVar5 = false;
  goto LAB_0013caae;
LAB_0013c8fb:
  SVar3.idx_ = groups.len;
  SVar3.sk_ = (stack_st_SSL_CIPHER *)groups.data;
  if (SVar13 == SVar3) goto LAB_0013c94a;
  pTVar9 = internal::StackIteratorImpl<stack_st_SSL_CIPHER>::operator*
                     ((StackIteratorImpl<stack_st_SSL_CIPHER> *)&groups);
  iVar6 = sk_SSL_CIPHER_find((stack_st_SSL_CIPHER *)
                             supported._M_t.
                             super___uniq_ptr_impl<stack_st_SSL_CIPHER,_bssl::internal::Deleter>.
                             _M_t.
                             super__Tuple_impl<0UL,_stack_st_SSL_CIPHER_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_stack_st_SSL_CIPHER_*,_false>._M_head_impl,
                             (size_t *)0x0,pTVar9);
  if ((iVar6 == 0) &&
     (sVar7 = OPENSSL_sk_push((OPENSSL_STACK *)
                              unsupported._M_t.
                              super___uniq_ptr_impl<stack_st_SSL_CIPHER,_bssl::internal::Deleter>.
                              _M_t.
                              super__Tuple_impl<0UL,_stack_st_SSL_CIPHER_*,_bssl::internal::Deleter>
                              .super__Head_base<0UL,_stack_st_SSL_CIPHER_*,_false>._M_head_impl,
                              pTVar9), sVar7 == 0)) goto LAB_0013caa2;
  groups.len = groups.len + 1;
  goto LAB_0013c8fb;
LAB_0013c94a:
  sVar7 = OPENSSL_sk_num((OPENSSL_STACK *)
                         unsupported._M_t.
                         super___uniq_ptr_impl<stack_st_SSL_CIPHER,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_stack_st_SSL_CIPHER_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_stack_st_SSL_CIPHER_*,_false>._M_head_impl);
  if ((sVar7 == 0) ||
     ((_Head_base<0UL,_bssl::SSLCipherPreferenceList_*,_false>)
      *(_Tuple_impl<0UL,_bssl::SSLCipherPreferenceList_*,_bssl::internal::Deleter> *)
       &(((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->cipher_list)._M_t.
        super___uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter> !=
      (SSLCipherPreferenceList *)0x0)) {
LAB_0013c968:
    groups.data = (uint8_t *)
                  unsupported._M_t.
                  super___uniq_ptr_impl<stack_st_SSL_CIPHER,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_stack_st_SSL_CIPHER_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_stack_st_SSL_CIPHER_*,_false>._M_head_impl;
    groups.len = 0;
    SVar13 = end<stack_st_SSL_CIPHER>
                       ((stack_st_SSL_CIPHER *)
                        unsupported._M_t.
                        super___uniq_ptr_impl<stack_st_SSL_CIPHER,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_stack_st_SSL_CIPHER_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_stack_st_SSL_CIPHER_*,_false>._M_head_impl);
    for (; SVar4.idx_ = groups.len, SVar4.sk_ = (stack_st_SSL_CIPHER *)groups.data, SVar13 != SVar4;
        groups.len = groups.len + 1) {
      pTVar9 = internal::StackIteratorImpl<stack_st_SSL_CIPHER>::operator*
                         ((StackIteratorImpl<stack_st_SSL_CIPHER> *)&groups);
      SSLCipherPreferenceList::Remove
                ((SSLCipherPreferenceList *)
                 (((ssl->config)._M_t.
                   super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->cipher_list)._M_t
                 .super___uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>,
                 pTVar9);
    }
    sk_00 = (OPENSSL_STACK *)SSL_get_ciphers((SSL *)ssl);
    sVar7 = OPENSSL_sk_num(sk_00);
    if ((sVar7 == 0) || (iVar6 = CBS_get_asn1(in,&groups,4), iVar6 == 0)) goto LAB_0013caa2;
    supported_groups.data_ = (unsigned_short *)0x0;
    supported_groups.size_ = 0;
    bVar5 = Array<unsigned_short>::InitUninitialized(&supported_groups,groups.len >> 1);
    if (bVar5) {
      uVar12 = 0;
      while (groups.len != 0) {
        iVar6 = CBS_get_u16(&groups,(uint16_t *)&new_configured_groups);
        if (iVar6 == 0) goto LAB_0013ca53;
        if (supported_groups.size_ <= uVar12) goto LAB_0013cc14;
        supported_groups.data_[uVar12] = (unsigned_short)new_configured_groups.data_;
        uVar12 = uVar12 + 1;
      }
      SVar14 = tls1_get_grouplist((ssl->s3->hs)._M_t.
                                  super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl)
      ;
      puVar10 = SVar14.data_;
      new_configured_groups.data_ = (unsigned_short *)0x0;
      new_configured_groups.size_ = 0;
      bVar5 = Array<unsigned_short>::InitUninitialized(&new_configured_groups,SVar14.size_);
      if (bVar5) {
        puVar1 = puVar10 + SVar14.size_;
        uVar12 = 0;
        for (; puVar10 != puVar1; puVar10 = puVar10 + 1) {
          lVar11 = 0;
          do {
            if (supported_groups.size_ * 2 == lVar11) goto LAB_0013cb47;
            puVar2 = (unsigned_short *)((long)supported_groups.data_ + lVar11);
            lVar11 = lVar11 + 2;
          } while (*puVar2 != *puVar10);
          if (new_configured_groups.size_ <= uVar12) goto LAB_0013cc14;
          new_configured_groups.data_[uVar12] = *puVar10;
          uVar12 = uVar12 + 1;
LAB_0013cb47:
        }
        if (uVar12 == 0) goto LAB_0013cbe7;
        if (new_configured_groups.size_ < uVar12) {
LAB_0013cc14:
          abort();
        }
        new_configured_groups.size_ = uVar12;
        Array<unsigned_short>::operator=
                  (&((ssl->config)._M_t.
                     super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->
                    supported_group_list,&new_configured_groups);
        local_58.data = (uint8_t *)0x0;
        local_58.len = 0;
        iVar6 = CBS_get_optional_asn1(in,&local_58,(int *)0x0,0x80000000);
        if (iVar6 == 0) goto LAB_0013cbe7;
        do {
          while( true ) {
            if (local_58.len == 0) {
              bVar5 = true;
              Vector<bssl::ALPSConfig>::clear
                        (&((ssl->config)._M_t.
                           super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->
                          alps_configs);
              goto LAB_0013cbe9;
            }
            iVar6 = CBS_get_u16(&local_58,&id_1);
            if (iVar6 == 0) goto LAB_0013cbe7;
            if (id_1 == 0x4469) break;
            if ((id_1 == 0x44cd) &&
               ((((ssl->config)._M_t.
                  super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->field_0x10e & 0x20
                ) != 0)) goto LAB_0013cbe3;
          }
        } while ((((ssl->config)._M_t.
                   super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->field_0x10e &
                 0x20) != 0);
LAB_0013cbe3:
        bVar5 = true;
      }
      else {
LAB_0013cbe7:
        bVar5 = false;
      }
LAB_0013cbe9:
      Array<unsigned_short>::~Array(&new_configured_groups);
    }
    else {
LAB_0013ca53:
      bVar5 = false;
    }
    Array<unsigned_short>::~Array(&supported_groups);
  }
  else {
    __p_00 = New<bssl::SSLCipherPreferenceList>();
    groups.data = (uint8_t *)0x0;
    std::__uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter> *)
               &((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>
                 ._M_t.super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->cipher_list,__p_00)
    ;
    std::unique_ptr<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter> *)&groups);
    this.super__Tuple_impl<0UL,_bssl::SSLCipherPreferenceList_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_bssl::SSLCipherPreferenceList_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_bssl::SSLCipherPreferenceList_*,_bssl::internal::Deleter> *)
          &(((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->cipher_list)._M_t.
           super___uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>;
    if ((this.super__Tuple_impl<0UL,_bssl::SSLCipherPreferenceList_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bssl::SSLCipherPreferenceList_*,_false>._M_head_impl !=
         (_Head_base<0UL,_bssl::SSLCipherPreferenceList_*,_false>)0x0) &&
       (bVar5 = SSLCipherPreferenceList::Init
                          ((SSLCipherPreferenceList *)
                           this.
                           super__Tuple_impl<0UL,_bssl::SSLCipherPreferenceList_*,_bssl::internal::Deleter>
                           .super__Head_base<0UL,_bssl::SSLCipherPreferenceList_*,_false>.
                           _M_head_impl,
                           (SSLCipherPreferenceList *)
                           (((ssl->ctx)._M_t.
                             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->cipher_list).
                           _M_t.
                           super___uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>
                          ), bVar5)) goto LAB_0013c968;
LAB_0013caa2:
    bVar5 = false;
  }
  std::unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter>::~unique_ptr(&unsupported);
LAB_0013caae:
  std::unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter>::~unique_ptr(&supported);
  return bVar5;
}

Assistant:

static bool apply_remote_features(SSL *ssl, CBS *in) {
  CBS ciphers;
  if (!CBS_get_asn1(in, &ciphers, CBS_ASN1_OCTETSTRING)) {
    return false;
  }
  bssl::UniquePtr<STACK_OF(SSL_CIPHER)> supported(sk_SSL_CIPHER_new_null());
  if (!supported) {
    return false;
  }
  while (CBS_len(&ciphers)) {
    uint16_t id;
    if (!CBS_get_u16(&ciphers, &id)) {
      return false;
    }
    const SSL_CIPHER *cipher = SSL_get_cipher_by_value(id);
    if (!cipher) {
      continue;
    }
    if (!sk_SSL_CIPHER_push(supported.get(), cipher)) {
      return false;
    }
  }
  STACK_OF(SSL_CIPHER) *configured =
      ssl->config->cipher_list ? ssl->config->cipher_list->ciphers.get()
                               : ssl->ctx->cipher_list->ciphers.get();
  bssl::UniquePtr<STACK_OF(SSL_CIPHER)> unsupported(sk_SSL_CIPHER_new_null());
  if (!unsupported) {
    return false;
  }
  for (const SSL_CIPHER *configured_cipher : configured) {
    if (sk_SSL_CIPHER_find(supported.get(), nullptr, configured_cipher)) {
      continue;
    }
    if (!sk_SSL_CIPHER_push(unsupported.get(), configured_cipher)) {
      return false;
    }
  }
  if (sk_SSL_CIPHER_num(unsupported.get()) && !ssl->config->cipher_list) {
    ssl->config->cipher_list = bssl::MakeUnique<SSLCipherPreferenceList>();
    if (!ssl->config->cipher_list ||
        !ssl->config->cipher_list->Init(*ssl->ctx->cipher_list)) {
      return false;
    }
  }
  for (const SSL_CIPHER *unsupported_cipher : unsupported.get()) {
    ssl->config->cipher_list->Remove(unsupported_cipher);
  }
  if (sk_SSL_CIPHER_num(SSL_get_ciphers(ssl)) == 0) {
    return false;
  }

  CBS groups;
  if (!CBS_get_asn1(in, &groups, CBS_ASN1_OCTETSTRING)) {
    return false;
  }
  Array<uint16_t> supported_groups;
  if (!supported_groups.InitForOverwrite(CBS_len(&groups) / 2)) {
    return false;
  }
  size_t idx = 0;
  while (CBS_len(&groups)) {
    uint16_t group;
    if (!CBS_get_u16(&groups, &group)) {
      return false;
    }
    supported_groups[idx++] = group;
  }
  Span<const uint16_t> configured_groups =
      tls1_get_grouplist(ssl->s3->hs.get());
  Array<uint16_t> new_configured_groups;
  if (!new_configured_groups.InitForOverwrite(configured_groups.size())) {
    return false;
  }
  idx = 0;
  for (uint16_t configured_group : configured_groups) {
    bool ok = false;
    for (uint16_t supported_group : supported_groups) {
      if (supported_group == configured_group) {
        ok = true;
        break;
      }
    }
    if (ok) {
      new_configured_groups[idx++] = configured_group;
    }
  }
  if (idx == 0) {
    return false;
  }
  new_configured_groups.Shrink(idx);
  ssl->config->supported_group_list = std::move(new_configured_groups);

  CBS alps;
  CBS_init(&alps, nullptr, 0);
  if (!CBS_get_optional_asn1(in, &alps, /*out_present=*/nullptr,
                             kHandoffTagALPS)) {
    return false;
  }
  bool supports_alps = false;
  while (CBS_len(&alps) != 0) {
    uint16_t id;
    if (!CBS_get_u16(&alps, &id)) {
      return false;
    }
    // For now, we support two ALPS codepoints, so we need to extract both
    // codepoints, and then filter what the handshaker might try to send.
    if ((id == TLSEXT_TYPE_application_settings &&
         ssl->config->alps_use_new_codepoint) ||
        (id == TLSEXT_TYPE_application_settings_old &&
         !ssl->config->alps_use_new_codepoint)) {
      supports_alps = true;
      break;
    }
  }
  if (!supports_alps) {
    ssl->config->alps_configs.clear();
  }

  return true;
}